

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnImportException
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index except_index,TypeVector *sig)

{
  Type *types;
  Enum EVar1;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnImportException(import_index: %u, except_index: %u, sig: ",
                 (ulong)import_index,(ulong)except_index);
  types = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_start;
  LogTypes(this,(Index)((ulong)((long)(sig->
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)types) >> 2)
           ,types);
  Stream::Writef(this->stream_,")\n");
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x14])
                    (this->reader_,(ulong)import_index,module_name.data_,module_name.size_,
                     field_name.data_,field_name.size_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportException(Index import_index,
                                              string_view module_name,
                                              string_view field_name,
                                              Index except_index,
                                              TypeVector& sig) {
  LOGF("OnImportException(import_index: %" PRIindex ", except_index: %" PRIindex
       ", sig: ",
       import_index, except_index);
  LogTypes(sig);
  LOGF_NOINDENT(")\n");
  return reader_->OnImportException(import_index, module_name, field_name,
                                    except_index, sig);
}